

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Directives.cpp
# Opt level: O0

bool DirectiveDefineLabel(ArgumentList *List,int flags)

{
  bool bVar1;
  Entry *pEVar2;
  CAssemblerLabel *this;
  CAssemblerLabel *labelCommand;
  int value;
  int flags_local;
  ArgumentList *List_local;
  
  labelCommand._4_4_ = flags;
  _value = List;
  pEVar2 = ArgumentList::operator[](List,1);
  bVar1 = ConvertExpression(&pEVar2->text,(int *)&labelCommand);
  if (bVar1) {
    pEVar2 = ArgumentList::operator[](_value,0);
    bVar1 = SymbolTable::isValidSymbolName(&pEVar2->text);
    if (bVar1) {
      this = (CAssemblerLabel *)operator_new(0x48);
      pEVar2 = ArgumentList::operator[](_value,0);
      CAssemblerLabel::CAssemblerLabel
                (this,&pEVar2->text,(ulong)(uint)labelCommand,Global.Section,true);
      AddAssemblerCommand((CAssemblerCommand *)this);
      List_local._7_1_ = true;
    }
    else {
      pEVar2 = ArgumentList::operator[](_value,0);
      Logger::printError<std::__cxx11::wstring>(Error,L"Invalid label name \"%s\"",&pEVar2->text);
      List_local._7_1_ = false;
    }
  }
  else {
    pEVar2 = ArgumentList::operator[](_value,1);
    Logger::printError<std::__cxx11::wstring>(Error,L"Invalid expression \"%s\"",&pEVar2->text);
    List_local._7_1_ = false;
  }
  return List_local._7_1_;
}

Assistant:

bool DirectiveDefineLabel(ArgumentList& List, int flags)
{
	int value;
	CAssemblerLabel* labelCommand;

	if (ConvertExpression(List[1].text,value) == false)
	{
		Logger::printError(Logger::Error,L"Invalid expression \"%s\"",List[1].text);
		return false;
	}
	
	if (Global.symbolTable.isValidSymbolName(List[0].text) == false)
	{
		Logger::printError(Logger::Error,L"Invalid label name \"%s\"",List[0].text);
		return false;
	}

	labelCommand = new CAssemblerLabel(List[0].text, (u32) value, Global.Section, true);
	AddAssemblerCommand(labelCommand);
	return true;
}